

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void handle_ast_error(ParserContext *context,RuleType rule_type,rule_function action)

{
  int iVar1;
  undefined1 local_e8 [4];
  wchar_t val;
  jmp_buf env;
  rule_function action_local;
  RuleType rule_type_local;
  ParserContext *context_local;
  
  env[0].__saved_mask.__val[0xf] = (unsigned_long)action;
  if ((context->stop_at_first_error & 1U) == 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)local_e8);
    ErrorList_set_local_rescue_env(context->errors,(jmp_buf_conflict *)local_e8);
    if (iVar1 == 0) {
      (*(code *)env[0].__saved_mask.__val[0xf])(context->builder,rule_type);
    }
  }
  else {
    (*action)(context->builder,rule_type);
  }
  return;
}

Assistant:

static void handle_ast_error(ParserContext* context, RuleType rule_type, rule_function action) {
    if (context->stop_at_first_error) {
        action(context->builder, rule_type);
        return;
    }

    jmp_buf env;
    int val = setjmp(env);
    ErrorList_set_local_rescue_env(context->errors, &env);
    if (val == 0) {    
        action(context->builder, rule_type);
    }
}